

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RandomFreakOperator.cpp
# Opt level: O2

void __thiscall lts2::RandomFreakOperator::Apply(RandomFreakOperator *this,Mat *X,Mat *Ax)

{
  Mat *pMVar1;
  long lVar2;
  int i;
  ulong uVar3;
  double dVar4;
  double dVar5;
  _InputArray local_68;
  Scalar_<double> local_50;
  
  cv::Mat::create((int)Ax,*(int *)&(this->super_LBDOperator).super_LinearOperator.field_0xc,1);
  cv::Scalar_<double>::Scalar_(&local_50,0.0);
  local_68.flags = -0x3efdfffa;
  local_68.sz.width = 1;
  local_68.sz.height = 4;
  local_68.obj = &local_50;
  cv::noArray();
  cv::Mat::setTo((_InputArray *)Ax,&local_68);
  pMVar1 = &(this->super_LBDOperator)._integralImage;
  if (*(long *)&(this->super_LBDOperator).field_0x28 != 0) {
    cv::Scalar_<double>::Scalar_(&local_50,0.0);
    local_68.flags = -0x3efdfffa;
    local_68.sz.width = 1;
    local_68.sz.height = 4;
    local_68.obj = &local_50;
    cv::noArray();
    cv::Mat::setTo((_InputArray *)pMVar1,&local_68);
  }
  local_50.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = 0.0;
  local_68.sz.width = 0;
  local_68.sz.height = 0;
  local_50.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]._0_4_ = 0x1010000;
  local_68.flags = 0x2010000;
  local_68.obj = pMVar1;
  local_50.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = (double)X;
  cv::integral((_InputArray *)&local_50,(_OutputArray *)&local_68,6);
  lVar2 = *(long *)(Ax + 0x10);
  for (uVar3 = 0; uVar3 < *(uint *)&(this->super_LBDOperator).super_LinearOperator.field_0xc;
      uVar3 = uVar3 + 1) {
    dVar4 = LBDOperator::measureAtCell
                      (&this->super_LBDOperator,
                       (this->super_LBDOperator)._basisFunctions[uVar3].pos_cell);
    dVar5 = LBDOperator::measureAtCell
                      (&this->super_LBDOperator,
                       (this->super_LBDOperator)._basisFunctions[uVar3].neg_cell);
    *(float *)(lVar2 + uVar3 * 4) = (float)(dVar4 - dVar5);
  }
  return;
}

Assistant:

void lts2::RandomFreakOperator::Apply(cv::Mat const& X, cv::Mat& Ax)
{
    // Create a column vector where rows = number_of_active_pairs
    Ax.create(_pairsInUse, 1, CV_32FC1);
    Ax.setTo(cv::Scalar(0));

    // Compute the integral image for later
    if (_integralImage.data)
        _integralImage.setTo(cv::Scalar(0));
    cv::integral(X, _integralImage, CV_64F);
    
    // Apply each pair
#ifdef WITH_DISPATCH
    dispatch_queue_t queue = dispatch_get_global_queue(DISPATCH_QUEUE_PRIORITY_HIGH, 0);
    dispatch_apply(_pairsInUse, queue,
                   ^(size_t i) {
                     double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
                     double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
                     *Ax.ptr<float>(i) = cv::saturate_cast<float>(mes_pos - mes_neg);
                   });
#else
    float* p_ax = Ax.ptr<float>(0);
    for (int i = 0; i < _pairsInUse; ++i)
    {
        double mes_pos = measureAtCell(_basisFunctions[i].pos_cell);
        double mes_neg = measureAtCell(_basisFunctions[i].neg_cell);
        
        *p_ax++ = cv::saturate_cast<float>(mes_pos - mes_neg);
    }
#endif
}